

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_column_schema.hpp
# Opt level: O2

void __thiscall duckdb::ParquetColumnSchema::~ParquetColumnSchema(ParquetColumnSchema *this)

{
  ::std::vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>::~vector
            (&(this->children).
              super_vector<duckdb::ParquetColumnSchema,_std::allocator<duckdb::ParquetColumnSchema>_>
            );
  LogicalType::~LogicalType(&this->type);
  ::std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

ParquetColumnSchema() = default;